

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.c
# Opt level: O3

void fill_lock_region(LockRegion *lr,float alphafactor,_Bool blended)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  float fVar5;
  float fVar6;
  
  if (0 < lock_region.h) {
    iVar3 = 0;
    iVar2 = lock_region.h;
    iVar1 = lock_region.w;
    do {
      if (0 < iVar1) {
        iVar4 = 0;
        do {
          fVar5 = (float)iVar4 / (float)(iVar1 + -1);
          fVar6 = (float)iVar3 / (float)(lock_region.h + -1);
          al_map_rgba_f(fVar5,fVar5 * fVar6,fVar6,fVar5 * alphafactor);
          if ((char)lr == '\0') {
            al_put_pixel(lock_region.x + iVar4,lock_region.y + iVar3);
          }
          else {
            al_put_blended_pixel();
          }
          iVar4 = iVar4 + 1;
          iVar2 = lock_region.h;
          iVar1 = lock_region.w;
        } while (iVar4 < lock_region.w);
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 < iVar2);
  }
  return;
}

Assistant:

static void fill_lock_region(LockRegion *lr, float alphafactor, bool blended)
{
   int x, y;
   float r, g, b, a;
   ALLEGRO_COLOR c;

   for (y = 0; y < lr->h; y++) {
      for (x = 0; x < lr->w; x++) {
         /* -1 to make the last pixel use the full color, allows easier
          * manual inspection of the test results as we have a fixed
          * color on each side.
          */
         r = (float)x / (lr->w - 1);
         b = (float)y / (lr->h - 1);
         g = r*b;
         a = r * alphafactor;
         c = al_map_rgba_f(r, g, b, a);
         if (blended)
            al_put_blended_pixel(lr->x + x, lr->y + y, c);
         else
            al_put_pixel(lr->x + x, lr->y + y, c);
      }
   }
}